

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O0

int re2::chartorune(Rune *rune,char *str)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Rune l;
  int c3;
  int c2;
  int c1;
  int c;
  char *str_local;
  Rune *rune_local;
  
  uVar3 = (uint)(byte)*str;
  if (uVar3 < 0x80) {
    *rune = uVar3;
    return 1;
  }
  uVar1 = (byte)str[1] ^ 0x80;
  if ((uVar1 & 0xc0) == 0) {
    if (uVar3 < 0xe0) {
      if ((0xbf < uVar3) && (uVar1 = (uVar3 & 0x1f) << 6 | uVar1, 0x7f < uVar1)) {
        *rune = uVar1;
        return 2;
      }
    }
    else {
      uVar2 = (byte)str[2] ^ 0x80;
      if ((uVar2 & 0xc0) == 0) {
        if (uVar3 < 0xf0) {
          uVar2 = ((uVar3 & 0xf) << 6 | uVar1) << 6 | uVar2;
          if (0x7ff < uVar2) {
            *rune = uVar2;
            return 3;
          }
        }
        else if ((((((byte)str[3] ^ 0x80) & 0xc0) == 0) && (uVar3 < 0xf8)) &&
                (uVar3 = (((uVar3 & 7) << 6 | uVar1) << 6 | uVar2) << 6 | (byte)str[3] ^ 0x80,
                0xffff < uVar3)) {
          *rune = uVar3;
          return 4;
        }
      }
    }
  }
  *rune = 0xfffd;
  return 1;
}

Assistant:

int
chartorune(Rune *rune, const char *str)
{
	int c, c1, c2, c3;
	Rune l;

	/*
	 * one character sequence
	 *	00000-0007F => T1
	 */
	c = *(unsigned char*)str;
	if(c < Tx) {
		*rune = c;
		return 1;
	}

	/*
	 * two character sequence
	 *	0080-07FF => T2 Tx
	 */
	c1 = *(unsigned char*)(str+1) ^ Tx;
	if(c1 & Testx)
		goto bad;
	if(c < T3) {
		if(c < T2)
			goto bad;
		l = ((c << Bitx) | c1) & Rune2;
		if(l <= Rune1)
			goto bad;
		*rune = l;
		return 2;
	}

	/*
	 * three character sequence
	 *	0800-FFFF => T3 Tx Tx
	 */
	c2 = *(unsigned char*)(str+2) ^ Tx;
	if(c2 & Testx)
		goto bad;
	if(c < T4) {
		l = ((((c << Bitx) | c1) << Bitx) | c2) & Rune3;
		if(l <= Rune2)
			goto bad;
		*rune = l;
		return 3;
	}

	/*
	 * four character sequence (21-bit value)
	 *	10000-1FFFFF => T4 Tx Tx Tx
	 */
	c3 = *(unsigned char*)(str+3) ^ Tx;
	if (c3 & Testx)
		goto bad;
	if (c < T5) {
		l = ((((((c << Bitx) | c1) << Bitx) | c2) << Bitx) | c3) & Rune4;
		if (l <= Rune3)
			goto bad;
		*rune = l;
		return 4;
	}

	/*
	 * Support for 5-byte or longer UTF-8 would go here, but
	 * since we don't have that, we'll just fall through to bad.
	 */

	/*
	 * bad decoding
	 */
bad:
	*rune = Bad;
	return 1;
}